

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * anon_unknown.dwarf_263068::AllCurves(void)

{
  bool bVar1;
  pointer __n;
  anon_struct_16_2_e7b2e0df *r;
  reference __x;
  vector<int,_std::allocator<int>_> *in_RDI;
  anon_struct_16_2_e7b2e0df *curve;
  iterator __end1;
  iterator __begin1;
  vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> *__range1;
  allocator<EC_builtin_curve> local_31;
  undefined1 local_30 [8];
  vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> curves;
  size_t num_curves;
  vector<int,_std::allocator<int>_> *nids;
  
  __n = (pointer)EC_get_builtin_curves((EC_builtin_curve *)0x0,0);
  curves.super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<EC_builtin_curve>::allocator(&local_31);
  std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>::vector
            ((vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> *)local_30,(size_type)__n,
             &local_31);
  std::allocator<EC_builtin_curve>::~allocator(&local_31);
  r = std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>::data
                ((vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> *)local_30);
  EC_get_builtin_curves
            ((EC_builtin_curve *)r,
             (size_t)curves.super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(in_RDI);
  __end1 = std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>::begin
                     ((vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> *)local_30);
  curve = (anon_struct_16_2_e7b2e0df *)
          std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>::end
                    ((vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<EC_builtin_curve_*,_std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>_>
                                     *)&curve), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<EC_builtin_curve_*,_std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>_>
          ::operator*(&__end1);
    std::vector<int,_std::allocator<int>_>::push_back(in_RDI,&__x->nid);
    __gnu_cxx::
    __normal_iterator<EC_builtin_curve_*,_std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>_>
    ::operator++(&__end1);
  }
  std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>::~vector
            ((vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> *)local_30);
  return in_RDI;
}

Assistant:

static std::vector<int> AllCurves() {
  const size_t num_curves = EC_get_builtin_curves(nullptr, 0);
  std::vector<EC_builtin_curve> curves(num_curves);
  EC_get_builtin_curves(curves.data(), num_curves);
  std::vector<int> nids;
  for (const auto &curve : curves) {
    nids.push_back(curve.nid);
  }
  return nids;
}